

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O2

int __thiscall Mapper::mapImmediate(Mapper *this,string *value,uchar *bytes,uint *length)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  ulong uStack_30;
  out_of_range anon_var_0;
  
  uVar2 = value->_M_string_length;
  if (uVar2 == 0) {
    return -1;
  }
  if (uVar2 == 1) {
    if (*(value->_M_dataplus)._M_p == '-') {
      return -1;
    }
LAB_001162c7:
    uStack_30 = std::__cxx11::stoull(value,(size_t *)0x0,0);
  }
  else {
    pcVar3 = (value->_M_dataplus)._M_p;
    if (*pcVar3 == '-') {
      if (((uVar2 < 4) || (pcVar3[1] != '\'')) || (pcVar3[uVar2 - 1] != '\'')) {
        uStack_30 = std::__cxx11::stoll(value,(size_t *)0x0,0);
        this = (Mapper *)value;
      }
      else if (uVar2 == 5) {
        if (pcVar3[2] != '\\') {
          return -1;
        }
        cVar1 = pcVar3[3];
        if (cVar1 == 'n') {
          uStack_30 = -10;
        }
        else if (cVar1 == 'r') {
          uStack_30 = -0xd;
        }
        else {
          if (cVar1 != 't') {
            return -1;
          }
          uStack_30 = -0x74;
        }
      }
      else {
        if (uVar2 != 4) {
          return -1;
        }
        uStack_30 = -(long)pcVar3[2];
      }
      iVar4 = mapInteger(this,uStack_30,bytes,length);
      return iVar4;
    }
    if ((*pcVar3 != '\'' || uVar2 < 3) || (pcVar3[uVar2 - 1] != '\'')) goto LAB_001162c7;
    if (uVar2 == 4) {
      if (pcVar3[1] != '\\') {
        return -1;
      }
      cVar1 = pcVar3[2];
      if (cVar1 == 'n') {
        uStack_30 = 10;
      }
      else if (cVar1 == 'r') {
        uStack_30 = 0xd;
      }
      else {
        if (cVar1 != 't') {
          return -1;
        }
        uStack_30 = 0x74;
      }
      goto LAB_001162db;
    }
    if (uVar2 != 3) {
      return -1;
    }
    uStack_30 = (ulong)pcVar3[1];
  }
  if (0xff < uStack_30) {
    if (uStack_30 < 0x10000) {
      *(short *)bytes = (short)uStack_30;
      *length = 2;
      return 0x20;
    }
    if (uStack_30 >> 0x20 == 0) {
      *(int *)bytes = (int)uStack_30;
      *length = 4;
      return 0x40;
    }
    *(ulong *)bytes = uStack_30;
    *length = 8;
    return 0x60;
  }
LAB_001162db:
  *bytes = (uchar)uStack_30;
  *length = 1;
  return 0;
}

Assistant:

int Mapper::mapImmediate(std::string value, unsigned char* bytes, unsigned int &length) {
	if (value.empty() || (value.length() == 1 && value[0] == '-'))
		return -1;
	try {
		if (value[0] == '-')
		{
			int64_t value64;
			if (value.length() > 3 && value[1] == '\'' && value[value.length() - 1] == '\'') {
				size_t diff = value.length() - 1 - 2;
				if (diff == 1) {
					value64 = -static_cast<int64_t>(value[2]);
				}
				else if (diff == 2 && value[2] == '\\') {
					switch (value[3]) {
					case 'n':
						value64 = -'\n';
						break;
					case 'r':
						value64 = -'\r';
						break;
					case 't':
						value64 = -'t';
						break;
					default:
						return -1;
					}

				}
				else
					return -1;
			}
			else
				value64 = std::stoll(value, nullptr,0);
			return mapInteger(value64, bytes, length);
		}
		else {
			uint64_t value64;
			if (value.length() > 2 && value[0] == '\'' && value[value.length() - 1] == '\'') {
				size_t diff = value.length() - 2;
				if (diff == 1) {
					value64 = static_cast<uint64_t>(value[1]);
				}
				else if (diff == 2 && value[1] == '\\') {
					switch (value[2]) {
					case 'n':
						value64 = '\n';
						break;
					case 'r':
						value64 = '\r';
						break;
					case 't':
						value64 = 't';
						break;
					default:
						return -1;
					}
				}
				else
					return -1;
			}
			else
				value64 = std::stoull(value, nullptr, 0);
			if (value64 <= UINT8_MAX) {
				*reinterpret_cast<uint8_t*>(bytes) = static_cast<uint8_t>(value64);
				length = sizeof(uint8_t);
				return Byte;
			}
			else if (value64 <= UINT16_MAX) {
				*reinterpret_cast<uint16_t*>(bytes) = static_cast<uint16_t>(value64);
				length = sizeof(uint16_t);
				return Short;
			}
			else if (value64 <= UINT32_MAX) {
				*reinterpret_cast<uint32_t*>(bytes) = static_cast<uint32_t>(value64);
				length = sizeof(uint32_t);
				return Dword;
			}
			else {
				*reinterpret_cast<uint64_t*>(bytes) = static_cast<uint64_t>(value64);
				length = sizeof(uint64_t);
				return Qword;
			}
		}
	}
	catch (std::invalid_argument) {
		return -1;
	}
	catch (std::out_of_range) {
		return -2;
	}
}